

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawWallMasked1PalCommand::Execute(DrawWallMasked1PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  
  iVar1 = *(int *)&(this->super_PalWall1Command).super_DrawerCommand.field_0xc;
  uVar2 = (this->super_PalWall1Command)._texturefrac;
  puVar5 = (this->super_PalWall1Command)._colormap;
  puVar6 = (this->super_PalWall1Command)._source;
  puVar11 = (this->super_PalWall1Command)._dest;
  iVar3 = (this->super_PalWall1Command)._fracbits;
  iVar4 = (this->super_PalWall1Command)._pitch;
  iVar7 = DrawerThread::count_for_thread
                    (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y,
                     (this->super_PalWall1Command)._count);
  if (0 < iVar7) {
    iVar8 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y);
    puVar11 = puVar11 + iVar8 * iVar4;
    iVar8 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y);
    uVar9 = iVar8 * iVar1 + uVar2;
    iVar8 = thread->num_cores;
    do {
      uVar10 = (ulong)puVar6[uVar9 >> ((byte)iVar3 & 0x3f)];
      if (uVar10 != 0) {
        *puVar11 = puVar5[uVar10];
      }
      uVar9 = uVar9 + iVar1 * iVar8;
      puVar11 = puVar11 + iVar8 * iVar4;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  return;
}

Assistant:

void DrawWallMasked1PalCommand::Execute(DrawerThread *thread)
	{
		uint32_t fracstep = _iscale;
		uint32_t frac = _texturefrac;
		uint8_t *colormap = _colormap;
		int count = _count;
		const uint8_t *source = _source;
		uint8_t *dest = _dest;
		int bits = _fracbits;
		int pitch = _pitch;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		do
		{
			uint8_t pix = source[frac >> bits];
			if (pix != 0)
			{
				*dest = colormap[pix];
			}
			frac += fracstep;
			dest += pitch;
		} while (--count);
	}